

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::toNumber(Forth *this)

{
  Char c;
  bool bVar1;
  uint valueLo;
  uint valueHi;
  Cell CVar2;
  size_t position;
  anon_union_8_4_a234c5df_for_data_ aStack_28;
  Char ch;
  DCell base;
  DCell ud1;
  Cell caddr1;
  Cell u1;
  Forth *this_local;
  
  requireDStackDepth(this,4,">NUMBER");
  ud1.data_.Cells.hi = ForthStack<unsigned_int>::getTop(&this->dStack);
  ud1.data_.Cells.lo = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueLo = ForthStack<unsigned_int>::getTop(&this->dStack,3);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  DCell::DCell(&base,valueLo,valueHi);
  CVar2 = getNumericBase(this);
  DCell::DCell((DCell *)&stack0xffffffffffffffd8,(ulong)CVar2);
  for (; ud1.data_.Cells.hi != 0; ud1.data_.Cells.hi = ud1.data_.Cells.hi - 1) {
    c = getDataChar(this,ud1.data_.Cells.lo);
    bVar1 = isValidDigit(this,c);
    if (!bVar1) break;
    CVar2 = digitValue(c);
    ud1.data_.Cells.lo = ud1.data_.Cells.lo + 1;
    base.data_ = (anon_union_8_4_a234c5df_for_data_)
                 ((long)base.data_ * aStack_28.Dcells + (ulong)CVar2);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,3,base.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,2,base.data_.Cells.hi);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,ud1.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,ud1.data_.Cells.hi);
  return;
}

Assistant:

void toNumber(){
			REQUIRE_DSTACK_DEPTH(4, ">NUMBER");
			Cell u1 = dStack.getTop();
			Cell caddr1 = dStack.getTop(1);
			DCell ud1(dStack.getTop(3),dStack.getTop(2));
			DCell base( getNumericBase() );
			while (u1 > 0){
				Char ch = getDataChar(caddr1);

				size_t position{} ;
				if (isValidDigit(ch)){
					position = digitValue(ch);
				} else {
					break;
				}
				--u1; ++caddr1;
				ud1.data_.Dcells = ud1.data_.Dcells * base.data_.Dcells + position;
			}
			dStack.setTop(3, ud1.data_.Cells.lo);
			dStack.setTop(2, ud1.data_.Cells.hi);
			dStack.setTop(1, caddr1);
			dStack.setTop(0, u1);


		}